

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  pointer pcVar1;
  size_type *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_40 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_40);
  (*this->_vptr_AbstractSocketWriter[2])(this,&local_40);
  if (local_40 != &__str._M_string_length) {
    operator_delete(local_40,__str._M_string_length + 1);
  }
  return;
}

Assistant:

void SendLn(const std::string& message) { Send(message + "\n"); }